

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void diy::
     reduce<diy::detail::KDTreePartition<BlockT,PointT>,diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,KDTreePartners *partners,
               KDTreePartition<BlockT,_PointT> *reduce,ReduceNeverSkip *skip)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  element_type *peVar6;
  size_type sVar7;
  ReductionFunctor<BlockT,_diy::detail::KDTreePartners> *in_RDX;
  Master *in_RDI;
  ReduceNeverSkip *in_R8;
  vector<int,_std::allocator<int>_> incoming_gids;
  uint i;
  int expected;
  uint round;
  int original_expected;
  shared_ptr<diy::spd::logger> log;
  int in_stack_fffffffffffff8bc;
  Master *in_stack_fffffffffffff8c0;
  Master *this;
  undefined4 in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8cc;
  Master *in_stack_fffffffffffff8d0;
  Master *in_stack_fffffffffffff8d8;
  Master *in_stack_fffffffffffff8e0;
  Master *in_stack_fffffffffffff8e8;
  int round_;
  ReductionFunctor<BlockT,_diy::detail::KDTreePartners> *in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  Master *in_stack_fffffffffffff900;
  SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip> local_6b8 [6];
  MemoryManagement *in_stack_fffffffffffff9e0;
  undefined1 in_stack_fffffffffffff9ef;
  Master *in_stack_fffffffffffff9f0;
  Master *in_stack_fffffffffffffab8;
  undefined1 local_3c8 [128];
  undefined1 local_348 [760];
  uint local_50 [5];
  int local_3c;
  ReduceNeverSkip *local_28;
  ReductionFunctor<BlockT,_diy::detail::KDTreePartners> *local_18;
  Master *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  get_logger();
  local_3c = Master::expected(local_8);
  for (local_50[0] = 0; uVar4 = (ulong)local_50[0],
      sVar5 = detail::KDTreePartners::rounds((KDTreePartners *)0x18df04), uVar4 < sVar5;
      local_50[0] = local_50[0] + 1) {
    peVar6 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18df31);
    spd::logger::debug<unsigned_int>(peVar6,"Round {}",local_50);
    std::function<void(BlockT*,diy::ReduceProxy_const&,diy::detail::KDTreePartners_const&)>::
    function<diy::detail::KDTreePartition<BlockT,PointT>const&,void>
              ((function<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>
                *)in_stack_fffffffffffff8d0,
               (KDTreePartition<BlockT,_PointT> *)
               CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
    detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::ReductionFunctor
              (in_stack_fffffffffffff8f0,(int)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
               (Callback *)in_stack_fffffffffffff8e0,(KDTreePartners *)in_stack_fffffffffffff8d8,
               (Assigner *)in_stack_fffffffffffff8d0);
    detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>::
    SkipInactiveOr((SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip> *)
                   (local_348 + 8),local_50[0],(KDTreePartners *)local_18,local_28);
    std::function<bool(int,diy::Master_const&)>::
    function<diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>,void>
              ((function<bool_(int,_const_diy::Master_&)> *)in_stack_fffffffffffff8d0,
               (SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip> *)
               CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
    Master::foreach<diy::detail::ReductionFunctor<BlockT,diy::detail::KDTreePartners>>
              (in_stack_fffffffffffff900,
               (ReductionFunctor<BlockT,_diy::detail::KDTreePartners> *)
               CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (Skip *)in_stack_fffffffffffff8f0);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x18e00a);
    detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::~ReductionFunctor
              ((ReductionFunctor<BlockT,_diy::detail::KDTreePartners> *)in_stack_fffffffffffff8c0);
    std::function<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>::
    ~function((function<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>
               *)0x18e024);
    Master::execute(in_stack_fffffffffffffab8);
    local_348._4_4_ = 0;
    for (local_348._0_4_ = 0; uVar1 = local_348._0_4_, uVar3 = Master::size((Master *)0x18e061),
        (uint)uVar1 < uVar3; local_348._0_4_ = local_348._0_4_ + 1) {
      Master::gid(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
      bVar2 = detail::KDTreePartners::active
                        ((KDTreePartners *)in_stack_fffffffffffff8e8,
                         (int)((ulong)in_stack_fffffffffffff8e0 >> 0x20),
                         (int)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      if (bVar2) {
        in_stack_fffffffffffff900 = (Master *)(local_3c8 + 0x68);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x18e0e2);
        in_stack_fffffffffffff8fc = local_50[0] + 1;
        in_stack_fffffffffffff8f0 = local_18;
        Master::gid(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
        detail::KDTreePartners::incoming
                  ((KDTreePartners *)in_stack_fffffffffffff900,in_stack_fffffffffffff8fc,
                   in_stack_fffffffffffff8f8,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8e8);
        sVar7 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(local_3c8 + 0x68));
        local_348._4_4_ = local_348._4_4_ + (int)sVar7;
        in_stack_fffffffffffff8e0 = local_8;
        Master::gid(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
        in_stack_fffffffffffff8e8 =
             (Master *)Master::incoming(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc);
        concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        ::clear((concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                 *)in_stack_fffffffffffff8d0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8d0);
      }
    }
    Master::set_expected(local_8,local_348._4_4_);
    local_3c8._80_8_ = (_Invoker_type)0x0;
    local_3c8._88_8_ = (ExternalStorage *)0x0;
    local_3c8._64_8_ = 0;
    local_3c8._72_8_ = (_Manager_type)0x0;
    local_3c8._48_8_ = (_Invoker_type)0x0;
    local_3c8._56_8_ = (void *)0x0;
    local_3c8._32_8_ = 0;
    local_3c8._40_8_ = (_Manager_type)0x0;
    local_3c8._16_8_ = (pointer)0x0;
    local_3c8._24_8_ = (void *)0x0;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (pointer)0x0;
    in_stack_fffffffffffff8d8 = (Master *)local_3c8;
    in_stack_fffffffffffff8d0 = local_8;
    MemoryManagement::MemoryManagement((MemoryManagement *)in_stack_fffffffffffff8c0);
    Master::flush(in_stack_fffffffffffff9f0,(bool)in_stack_fffffffffffff9ef,
                  in_stack_fffffffffffff9e0);
    MemoryManagement::~MemoryManagement((MemoryManagement *)in_stack_fffffffffffff8c0);
  }
  peVar6 = std::__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<diy::spd::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x18e32c);
  round_ = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
  spd::logger::debug<unsigned_int>(peVar6,"Round {}",local_50);
  this = local_8;
  uVar3 = local_50[0];
  std::function<void(BlockT*,diy::ReduceProxy_const&,diy::detail::KDTreePartners_const&)>::
  function<diy::detail::KDTreePartition<BlockT,PointT>const&,void>
            ((function<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>
              *)in_stack_fffffffffffff8d0,
             (KDTreePartition<BlockT,_PointT> *)CONCAT44(local_50[0],in_stack_fffffffffffff8c8));
  detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::ReductionFunctor
            (in_stack_fffffffffffff8f0,round_,(Callback *)in_stack_fffffffffffff8e0,
             (KDTreePartners *)in_stack_fffffffffffff8d8,(Assigner *)in_stack_fffffffffffff8d0);
  detail::SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip>::SkipInactiveOr
            (local_6b8,local_50[0],(KDTreePartners *)local_18,local_28);
  std::function<bool(int,diy::Master_const&)>::
  function<diy::detail::SkipInactiveOr<diy::detail::KDTreePartners,diy::detail::ReduceNeverSkip>,void>
            ((function<bool_(int,_const_diy::Master_&)> *)in_stack_fffffffffffff8d0,
             (SkipInactiveOr<diy::detail::KDTreePartners,_diy::detail::ReduceNeverSkip> *)
             CONCAT44(uVar3,in_stack_fffffffffffff8c8));
  Master::foreach<diy::detail::ReductionFunctor<BlockT,diy::detail::KDTreePartners>>
            (in_stack_fffffffffffff900,
             (ReductionFunctor<BlockT,_diy::detail::KDTreePartners> *)
             CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             (Skip *)in_stack_fffffffffffff8f0);
  std::function<bool_(int,_const_diy::Master_&)>::~function
            ((function<bool_(int,_const_diy::Master_&)> *)0x18e405);
  detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::~ReductionFunctor
            ((ReductionFunctor<BlockT,_diy::detail::KDTreePartners> *)this);
  std::function<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>::
  ~function((function<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>
             *)0x18e41f);
  Master::set_expected(local_8,local_3c);
  std::shared_ptr<diy::spd::logger>::~shared_ptr((shared_ptr<diy::spd::logger> *)0x18e442);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}